

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

string * stripAllGeneratorExpressions(string *__return_storage_ptr__,string *input)

{
  long lVar1;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  size_type traversed;
  char *cStart;
  char *c;
  string local_70 [36];
  int local_4c;
  size_type sStack_48;
  int nestingLevel;
  size_type lastPos;
  size_type pos;
  string result;
  string *input_local;
  
  result.field_2._8_8_ = input;
  std::__cxx11::string::string((string *)&pos);
  lastPos = 0;
  local_4c = 0;
  do {
    sStack_48 = lastPos;
    lastPos = std::__cxx11::string::find(result.field_2._8_8_,0xa638a8);
    if (lastPos == 0xffffffffffffffff) {
      if (local_4c == 0) {
        std::__cxx11::string::substr((ulong)local_f8,result.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)&pos,local_f8);
        std::__cxx11::string::~string(local_f8);
      }
      cmGeneratorExpression::StripEmptyListElements(__return_storage_ptr__,(string *)&pos);
      std::__cxx11::string::~string((string *)&pos);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)local_70,result.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)&pos,local_70);
    std::__cxx11::string::~string(local_70);
    lastPos = lastPos + 2;
    local_4c = 1;
    lVar1 = std::__cxx11::string::c_str();
    traversed = lVar1 + lastPos;
    for (cStart = (char *)traversed; *cStart != '\0'; cStart = cStart + 1) {
      if ((*cStart == '$') && (cStart[1] == '<')) {
        local_4c = local_4c + 1;
        cStart = cStart + 1;
      }
      else if ((*cStart == '>') && (local_4c = local_4c + -1, local_4c == 0)) break;
    }
    local_98 = cStart + (1 - traversed);
    if (*cStart == '\0') {
      std::__cxx11::string::substr((ulong)&local_d8,result.field_2._8_8_);
      std::operator+(&local_b8,"$<",&local_d8);
      std::__cxx11::string::operator+=((string *)&pos,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    lastPos = (size_type)(local_98 + lastPos);
  } while( true );
}

Assistant:

static std::string stripAllGeneratorExpressions(const std::string &input)
{
  std::string result;
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;
  int nestingLevel = 0;
  while((pos = input.find("$<", lastPos)) != input.npos)
    {
    result += input.substr(lastPos, pos - lastPos);
    pos += 2;
    nestingLevel = 1;
    const char *c = input.c_str() + pos;
    const char * const cStart = c;
    for ( ; *c; ++c)
      {
      if(c[0] == '$' && c[1] == '<')
        {
        ++nestingLevel;
        ++c;
        continue;
        }
      if(c[0] == '>')
        {
        --nestingLevel;
        if (nestingLevel == 0)
          {
          break;
          }
        }
      }
    const std::string::size_type traversed = (c - cStart) + 1;
    if (!*c)
      {
      result += "$<" + input.substr(pos, traversed);
      }
    pos += traversed;
    lastPos = pos;
    }
  if (nestingLevel == 0)
    {
    result += input.substr(lastPos);
    }
  return cmGeneratorExpression::StripEmptyListElements(result);
}